

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrinter.cpp
# Opt level: O0

void __thiscall PrettyPrinter::visit(PrettyPrinter *this,FnCall *node)

{
  bool bVar1;
  pointer pIVar2;
  pointer this_00;
  pointer pEVar3;
  __normal_iterator<const_std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>_*,_std::vector<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>,_std::allocator<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>_>_>_>
  local_38;
  __normal_iterator<const_std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>_*,_std::vector<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>,_std::allocator<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>_>_>_>
  local_30;
  __normal_iterator<const_std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>_*,_std::vector<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>,_std::allocator<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>_>_>_>
  local_28;
  __normal_iterator<const_std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>_*,_std::vector<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>,_std::allocator<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>_>_>_>
  local_20;
  const_iterator iter;
  FnCall *node_local;
  PrettyPrinter *this_local;
  
  iter._M_current = (unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *)node;
  std::operator<<((ostream *)&std::cout,"(call ");
  pIVar2 = std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>::operator->
                     ((unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_> *)
                      (iter._M_current + 1));
  (*(pIVar2->super_Expr).super_Stmt._vptr_Stmt[2])(pIVar2,this);
  std::operator<<((ostream *)&std::cout," with args ");
  local_20._M_current =
       (unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *)
       std::
       vector<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>,_std::allocator<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>_>_>
       ::cbegin((vector<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>,_std::allocator<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>_>_>
                 *)(iter._M_current + 2));
  while( true ) {
    local_28._M_current =
         (unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *)
         std::
         vector<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>,_std::allocator<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>_>_>
         ::cend((vector<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>,_std::allocator<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>_>_>
                 *)(iter._M_current + 2));
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>_*,_std::vector<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>,_std::allocator<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>_>_>_>
              ::operator->(&local_20);
    pEVar3 = std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>::get(this_00);
    (*(pEVar3->super_Stmt)._vptr_Stmt[2])(pEVar3,this);
    local_30 = __gnu_cxx::
               __normal_iterator<const_std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>_*,_std::vector<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>,_std::allocator<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>_>_>_>
               ::operator+(&local_20,1);
    local_38._M_current =
         (unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *)
         std::
         vector<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>,_std::allocator<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>_>_>
         ::cend((vector<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>,_std::allocator<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>_>_>
                 *)(iter._M_current + 2));
    bVar1 = __gnu_cxx::operator!=(&local_30,&local_38);
    if (bVar1) {
      std::operator<<((ostream *)&std::cout," ");
    }
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>_*,_std::vector<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>,_std::allocator<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>_>_>_>
    ::operator++(&local_20);
  }
  std::operator<<((ostream *)&std::cout,")");
  return;
}

Assistant:

void PrettyPrinter::visit(AST::FnCall *node) {
    std::cout << "(call ";
    node->m_ident->accept(this);
    std::cout << " with args ";
    for (auto iter = node->m_args.cbegin(); iter != node->m_args.cend(); ++iter) {
        iter->get()->accept(this);
        if (iter + 1 != node->m_args.cend()) {
            std::cout << " ";
        }
    }
    std::cout << ")";
}